

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O0

void __thiscall
rsg::ProgramExecutor::setTexture
          (ProgramExecutor *this,int samplerNdx,TextureCube *texture,Sampler *sampler)

{
  mapped_type *this_00;
  SamplerCube local_70;
  Sampler *local_28;
  Sampler *sampler_local;
  TextureCube *texture_local;
  ProgramExecutor *pPStack_10;
  int samplerNdx_local;
  ProgramExecutor *this_local;
  
  local_28 = sampler;
  sampler_local = (Sampler *)texture;
  texture_local._4_4_ = samplerNdx;
  pPStack_10 = this;
  SamplerCube::SamplerCube(&local_70,texture,sampler);
  this_00 = std::
            map<int,_rsg::SamplerCube,_std::less<int>,_std::allocator<std::pair<const_int,_rsg::SamplerCube>_>_>
            ::operator[](&this->m_samplersCube,(key_type *)((long)&texture_local + 4));
  SamplerCube::operator=(this_00,&local_70);
  return;
}

Assistant:

void ProgramExecutor::setTexture (int samplerNdx, const tcu::TextureCube* texture, const tcu::Sampler& sampler)
{
	m_samplersCube[samplerNdx] = SamplerCube(texture, sampler);
}